

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O1

void __thiscall QAbstractButtonPrivate::emitClicked(QAbstractButtonPrivate *this)

{
  QObject *button;
  QButtonGroup *this_00;
  int _t1;
  int *piVar1;
  long in_FS_OFFSET;
  byte local_39;
  void *local_38;
  byte *pbStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  button = *(QObject **)&(this->super_QWidgetPrivate).field_0x8;
  if (button == (QObject *)0x0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(button);
  }
  local_39 = (byte)this->field_0x28c >> 1 & 1;
  pbStack_30 = &local_39;
  local_38 = (void *)0x0;
  QMetaObject::activate(button,&QAbstractButton::staticMetaObject,2,&local_38);
  if (piVar1 != (int *)0x0) {
    if (((button != (QObject *)0x0) && (piVar1[1] != 0)) &&
       (this_00 = this->group, this_00 != (QButtonGroup *)0x0)) {
      _t1 = QButtonGroup::id(this_00,(QAbstractButton *)button);
      QButtonGroup::idClicked(this_00,_t1);
      if (piVar1 == (int *)0x0) goto LAB_003c4ccc;
      if ((piVar1[1] != 0) && (this->group != (QButtonGroup *)0x0)) {
        QButtonGroup::buttonClicked(this->group,(QAbstractButton *)button);
      }
    }
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        operator_delete(piVar1);
      }
    }
  }
LAB_003c4ccc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButtonPrivate::emitClicked()
{
    Q_Q(QAbstractButton);
    QPointer<QAbstractButton> guard(q);
    emit q->clicked(checked);
#if QT_CONFIG(buttongroup)
    if (guard && group) {
        emit group->idClicked(group->id(q));
        if (guard && group)
            emit group->buttonClicked(q);
    }
#endif
}